

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

char * AllocGenaHeaders(char *propertySet)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  char *__s;
  int local_24;
  int rc;
  int line;
  size_t headers_size;
  char *headers;
  char *propertySet_local;
  
  local_24 = 0;
  sVar4 = strlen(AllocGenaHeaders::HEADER_LINE_1);
  sVar5 = strlen(AllocGenaHeaders::HEADER_LINE_2A);
  sVar6 = strlen(AllocGenaHeaders::HEADER_LINE_2B);
  sVar7 = strlen(AllocGenaHeaders::HEADER_LINE_3);
  sVar8 = strlen(AllocGenaHeaders::HEADER_LINE_4);
  sVar4 = sVar4 + sVar5 + sVar6 + sVar7 + sVar8 + 0x15;
  __s = (char *)malloc(sVar4);
  pcVar2 = AllocGenaHeaders::HEADER_LINE_2A;
  pcVar1 = AllocGenaHeaders::HEADER_LINE_1;
  if (__s == (char *)0x0) {
    local_24 = 0x1bb;
  }
  else {
    sVar5 = strlen(propertySet);
    uVar3 = snprintf(__s,sVar4,"%s%s%zu%s%s%s",pcVar1,pcVar2,sVar5 + 2,
                     AllocGenaHeaders::HEADER_LINE_2B,AllocGenaHeaders::HEADER_LINE_3,
                     AllocGenaHeaders::HEADER_LINE_4);
    if ((-1 < (int)uVar3) && (uVar3 < sVar4)) {
      return __s;
    }
  }
  UpnpPrintf(UPNP_ALL,GENA,".upnp/src/gena/gena_device.c",local_24,
             "AllocGenaHeaders(): Error UPNP_E_OUTOF_MEMORY\n");
  return __s;
}

Assistant:

static char *AllocGenaHeaders(
	/*! [in] The property set string. */
	const DOMString propertySet)
{
	static const char *HEADER_LINE_1 =
		"CONTENT-TYPE: text/xml; charset=\"utf-8\"\r\n";
	static const char *HEADER_LINE_2A = "CONTENT-LENGTH: ";
	static const char *HEADER_LINE_2B = "\r\n";
	static const char *HEADER_LINE_3 = "NT: upnp:event\r\n";
	static const char *HEADER_LINE_4 = "NTS: upnp:propchange\r\n";
	char *headers = NULL;
	size_t headers_size = 0;
	int line = 0;
	int rc = 0;

	headers_size = strlen(HEADER_LINE_1) + strlen(HEADER_LINE_2A) +
		       MAX_CONTENT_LENGTH + strlen(HEADER_LINE_2B) +
		       strlen(HEADER_LINE_3) + strlen(HEADER_LINE_4) + 1;
	headers = (char *)malloc(headers_size);
	if (headers == NULL) {
		line = __LINE__;
		goto ExitFunction;
	}
	rc = snprintf(headers,
		headers_size,
		"%s%s%" PRIzu "%s%s%s",
		HEADER_LINE_1,
		HEADER_LINE_2A,
		strlen(propertySet) + 2,
		HEADER_LINE_2B,
		HEADER_LINE_3,
		HEADER_LINE_4);

ExitFunction:
	if (headers == NULL || rc < 0 || (unsigned int)rc >= headers_size) {
		UpnpPrintf(UPNP_ALL,
			GENA,
			__FILE__,
			line,
			"AllocGenaHeaders(): Error UPNP_E_OUTOF_MEMORY\n");
	}
	return headers;
}